

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::SetUp(BasicAuthIntegrationTest *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Exposer *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  undefined1 local_38 [32];
  
  IntegrationTest::SetUp(&this->super_IntegrationTest);
  IntegrationTest::RegisterSomeCounter
            ((IntegrationTest *)local_38,(string *)this,&this->counter_name_);
  uVar2 = local_38._8_8_;
  uVar1 = local_38._0_8_;
  local_38._0_8_ = (_func_int **)0x0;
  local_38._8_8_ = (GTestFlagSaver *)0x0;
  this_00 = (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((GTestFlagSaver *)local_38._8_8_ != (GTestFlagSaver *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
  }
  this_01 = (this->super_IntegrationTest).exposer_._M_t.
            super___uniq_ptr_impl<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>.
            _M_t.
            super__Tuple_impl<0UL,_prometheus::Exposer_*,_std::default_delete<prometheus::Exposer>_>
            .super__Head_base<0UL,_prometheus::Exposer_*,_false>._M_head_impl;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:212:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:212:9)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  local_38._0_8_ = local_38 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Some Auth Realm","");
  Exposer::RegisterAuth
            (this_01,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_58,(string *)local_38,
             &(this->super_IntegrationTest).default_metrics_path_);
  if ((undefined1 *)local_38._0_8_ != local_38 + 0x10) {
    operator_delete((void *)local_38._0_8_);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }